

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStepConsequentFixed(SscWriterGeneric *this)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->m_AllSendingReaderRanks)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::emplace_back<>
              (&this->m_MpiRequests);
    MPI_Isend((this->super_SscWriterBase).m_Buffer.m_Buffer,
              (int)(this->super_SscWriterBase).m_Buffer.m_Size,&ompi_mpi_char,
              (int)*(size_type *)(p_Var1 + 1),0,(this->super_SscWriterBase).m_StreamComm,
              (this->m_MpiRequests).
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -1);
  }
  return;
}

Assistant:

void SscWriterGeneric::EndStepConsequentFixed()
{
    for (const auto &i : m_AllSendingReaderRanks)
    {
        m_MpiRequests.emplace_back();
        MPI_Isend(m_Buffer.data(), static_cast<int>(m_Buffer.size()), MPI_CHAR, i.first, 0,
                  m_StreamComm, &m_MpiRequests.back());
    }
}